

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void pnga_set_irreg_distr(Integer g_a,Integer *mapc,Integer *nblock)

{
  global_array_t *pgVar1;
  C_Integer *pCVar2;
  ulong uVar3;
  long lVar4;
  long icode;
  long lVar5;
  global_array_t *pgVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  lVar7 = g_a + 1000;
  if (GA[g_a + 1000].actv == 1) {
    pnga_error("Cannot set irregular data distribution on array that has been allocated",0);
  }
  if (GA[lVar7].ndim < 1) {
    pnga_error("Dimensions must be set before irregular distribution is specified",0);
  }
  pgVar6 = GA;
  for (lVar8 = 0; uVar3 = (ulong)pgVar6[lVar7].ndim, lVar8 < (long)uVar3; lVar8 = lVar8 + 1) {
    if (pgVar6[g_a + 1000].dims[lVar8] < nblock[lVar8]) {
      pnga_error("number of blocks must be <= corresponding dimension",lVar8);
      pgVar6 = GA;
    }
  }
  lVar8 = 0;
  lVar5 = 0;
  while( true ) {
    lVar4 = (long)(short)uVar3;
    if (lVar4 <= lVar5) break;
    lVar4 = mapc[lVar8];
    if ((lVar4 < 1) || (pgVar6[lVar7].dims[lVar5] + 1 < lVar4)) {
      pnga_error("Mapc entry outside array dimension limits",lVar4);
    }
    for (lVar9 = 1; lVar9 < nblock[lVar5]; lVar9 = lVar9 + 1) {
      icode = mapc[lVar8 + lVar9];
      if (icode < lVar4) {
        pnga_error("Mapc entries are not properly monotonic",lVar4);
        icode = mapc[lVar8 + lVar9];
      }
      if ((icode < 1) || (GA[lVar7].dims[lVar5] + 1 < icode)) {
        pnga_error("Mapc entry outside array dimension limits",icode);
      }
      lVar4 = icode;
    }
    lVar5 = lVar5 + 1;
    uVar3 = (ulong)(ushort)GA[lVar7].ndim;
    lVar8 = lVar8 + lVar9;
    pgVar6 = GA;
  }
  lVar8 = 0;
  if (lVar4 < 1) {
    lVar4 = lVar8;
  }
  for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    lVar8 = lVar8 + nblock[lVar5];
    pgVar6[lVar7].nblock[lVar5] = (int)nblock[lVar5];
  }
  pCVar2 = (C_Integer *)malloc(lVar8 * 8 + 8);
  pgVar6[lVar7].mapc = pCVar2;
  pgVar1 = GA;
  pgVar6 = GA + lVar7;
  lVar4 = 0;
  lVar5 = 0;
  if (0 < lVar8) {
    lVar5 = lVar8;
  }
  for (; lVar5 != lVar4; lVar4 = lVar4 + 1) {
    pgVar6->mapc[lVar4] = mapc[lVar4];
  }
  pgVar6->mapc[lVar8] = -1;
  pgVar1[lVar7].irreg = 1;
  return;
}

Assistant:

void pnga_set_irreg_distr(Integer g_a, Integer *mapc, Integer *nblock)
{
  Integer i, j, ichk, maplen;
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot set irregular data distribution on array that has been allocated",0);
  if (GA[ga_handle].ndim < 1)
    pnga_error("Dimensions must be set before irregular distribution is specified",0);
  for (i=0; i<GA[ga_handle].ndim; i++)
    if ((C_Integer)nblock[i] > GA[ga_handle].dims[i])
      pnga_error("number of blocks must be <= corresponding dimension",i);
  /* Check to see that mapc array is sensible */
  maplen = 0;
  for (i=0; i<GA[ga_handle].ndim; i++) {
    ichk = mapc[maplen];
    if (ichk < 1 || ichk > GA[ga_handle].dims[i]+1)
      pnga_error("Mapc entry outside array dimension limits",ichk);
    maplen++;
    for (j=1; j<nblock[i]; j++) {
      if (mapc[maplen] < ichk) {
        pnga_error("Mapc entries are not properly monotonic",ichk);
      }
      ichk = mapc[maplen];
      if (ichk < 1 || ichk > GA[ga_handle].dims[i]+1)
        pnga_error("Mapc entry outside array dimension limits",ichk);
      maplen++;
    }
  }

  maplen = 0;
  for (i=0; i<GA[ga_handle].ndim; i++) {
    maplen += nblock[i];
    GA[ga_handle].nblock[i] = (C_Integer)nblock[i];
  }
  GA[ga_handle].mapc = (C_Integer*)malloc((maplen+1)*sizeof(C_Integer*));
  for (i=0; i<maplen; i++) {
    GA[ga_handle].mapc[i] = (C_Integer)mapc[i];
  }
  GA[ga_handle].mapc[maplen] = -1;
  GA[ga_handle].irreg = 1;
}